

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::simultaneousUsePrimaryBufferTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  RefData<vk::Handle<(vk::HandleType)10>_> data_01;
  RefData<vk::Handle<(vk::HandleType)10>_> data_02;
  RefData<vk::Handle<(vk::HandleType)6>_> data_03;
  RefData<vk::Handle<(vk::HandleType)6>_> data_04;
  VkResult VVar2;
  VkDevice device;
  DeviceInterface *vk_00;
  VkQueue pVVar3;
  Handle<(vk::HandleType)10> *pHVar4;
  VkCommandBuffer_s **ppVVar5;
  Handle<(vk::HandleType)6> *pHVar6;
  allocator<char> local_3b9;
  string local_3b8;
  undefined4 local_398;
  allocator<char> local_391;
  string local_390;
  deUint64 local_370;
  int local_364;
  deUint64 dStack_360;
  VkResult result;
  deUint64 local_358;
  deUint64 local_350;
  undefined8 uStack_348;
  VkSubmitInfo submitInfo;
  Move<vk::Handle<(vk::HandleType)6>_> local_2f8;
  RefData<vk::Handle<(vk::HandleType)6>_> local_2d8;
  undefined1 local_2b8 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence2;
  RefData<vk::Handle<(vk::HandleType)6>_> local_278;
  undefined1 local_258 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence1;
  Move<vk::Handle<(vk::HandleType)10>_> local_228;
  RefData<vk::Handle<(vk::HandleType)10>_> local_208;
  undefined1 local_1e8 [8];
  Unique<vk::Handle<(vk::HandleType)10>_> eventTwo;
  RefData<vk::Handle<(vk::HandleType)10>_> local_1a8;
  undefined1 local_188 [8];
  Unique<vk::Handle<(vk::HandleType)10>_> eventOne;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  Move<vk::VkCommandBuffer_s_*> local_140;
  RefData<vk::VkCommandBuffer_s_*> local_120;
  undefined1 local_100 [8];
  Unique<vk::VkCommandBuffer_s_*> primCmdBuf;
  VkCommandBufferAllocateInfo cmdBufParams;
  Move<vk::Handle<(vk::HandleType)24>_> local_b0;
  RefData<vk::Handle<(vk::HandleType)24>_> local_90;
  undefined1 local_70 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandPoolCreateInfo cmdPoolParams;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  DeviceInterface *vk;
  VkDevice vkDevice;
  Context *context_local;
  
  device = Context::getDevice(context);
  vk_00 = Context::getDeviceInterface(context);
  pVVar3 = Context::getUniversalQueue(context);
  Context::getUniversalQueueFamilyIndex(context);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ = 0x27;
  ::vk::createCommandPool
            (&local_b0,vk_00,device,
             (VkCommandPoolCreateInfo *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_90,(Move *)&local_b0);
  data.deleter.m_deviceIface = local_90.deleter.m_deviceIface;
  data.object.m_internal = local_90.object.m_internal;
  data.deleter.m_device._0_4_ = (int)local_90.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_90.deleter.m_device >> 0x20);
  data.deleter.m_allocator = local_90.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_70,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_b0);
  primCmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._0_4_ = 0x28;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_70);
  ::vk::allocateCommandBuffer
            (&local_140,vk_00,device,
             (VkCommandBufferAllocateInfo *)
             &primCmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_120,(Move *)&local_140);
  data_00.deleter.m_deviceIface = local_120.deleter.m_deviceIface;
  data_00.object = local_120.object;
  data_00.deleter.m_device._0_4_ = (int)local_120.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_120.deleter.m_device >> 0x20);
  data_00.deleter.m_pool.m_internal = local_120.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_100,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_140);
  eventOne.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x2a;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)
                    &eventTwo.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                     m_allocator,vk_00,device,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1a8,
             (Move *)&eventTwo.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                      m_allocator);
  data_01.deleter.m_deviceIface = local_1a8.deleter.m_deviceIface;
  data_01.object.m_internal = local_1a8.object.m_internal;
  data_01.deleter.m_device._0_4_ = (int)local_1a8.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_1a8.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator = local_1a8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_188,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)10>_> *)
             &eventTwo.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator);
  ::vk::createEvent(&local_228,vk_00,device,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_208,(Move *)&local_228);
  data_02.deleter.m_deviceIface = local_208.deleter.m_deviceIface;
  data_02.object.m_internal = local_208.object.m_internal;
  data_02.deleter.m_device._0_4_ = (int)local_208.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_208.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator = local_208.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_1e8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move(&local_228);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_188);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x1d])(vk_00,device,pHVar4->m_internal);
  ::vk::checkResult(VVar2,"vk.resetEvent(vkDevice, *eventOne)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8b4);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_100);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x49])
                    (vk_00,*ppVVar5,
                     &eventOne.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                      m_allocator);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8b7);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_100);
  pVVar1 = *ppVVar5;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_188);
  (*vk_00->_vptr_DeviceInterface[0x6c])(vk_00,pVVar1,1,pHVar4,0x4000,0x10000,0,0,0,0,0,0);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_100);
  pVVar1 = *ppVVar5;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_1e8);
  fence1.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar4->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x6a])
            (vk_00,pVVar1,
             fence1.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator,0x10000
            );
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_100);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar5);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8bf);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)
                    &fence2.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator
                    ,vk_00,device,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_278,
             (Move *)&fence2.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                      m_allocator);
  data_03.deleter.m_deviceIface = local_278.deleter.m_deviceIface;
  data_03.object.m_internal = local_278.object.m_internal;
  data_03.deleter.m_device._0_4_ = (int)local_278.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_278.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator = local_278.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_258,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)
             &fence2.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator);
  ::vk::createFence(&local_2f8,vk_00,device,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2d8,(Move *)&local_2f8);
  data_04.deleter.m_deviceIface = local_2d8.deleter.m_deviceIface;
  data_04.object.m_internal = local_2d8.object.m_internal;
  data_04.deleter.m_device._0_4_ = (int)local_2d8.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_2d8.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator = local_2d8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_2b8,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_2f8);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_348 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_100);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_258);
  local_350 = pHVar6->m_internal;
  VVar2 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar3,1,&uStack_348,local_350);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, *fence1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8d4);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_2b8);
  local_358 = pHVar6->m_internal;
  VVar2 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar3,1,&uStack_348,local_358);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, *fence2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8d7);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_258);
  (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device,1,pHVar6,0,100000);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_2b8);
  (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device,1,pHVar6,0,100000);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_188);
  dStack_360 = pHVar4->m_internal;
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x1c])(vk_00,device,dStack_360);
  ::vk::checkResult(VVar2,"vk.setEvent(vkDevice, *eventOne)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8de);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_258);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device,1,pHVar6,0,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1, &fence1.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8e1);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_2b8);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device,1,pHVar6,0,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1, &fence2.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8e3);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_1e8);
  local_370 = pHVar4->m_internal;
  local_364 = (*vk_00->_vptr_DeviceInterface[0x1b])(vk_00,device,local_370);
  if (local_364 == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,"simultaneous use - primary buffers test succeeded",&local_391);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator(&local_391);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"simultaneous use - primary buffers test FAILED",&local_3b9);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
  }
  local_398 = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_2b8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_258);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_1e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_188);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_100);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus simultaneousUsePrimaryBufferTest(Context& context)
{

	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			//	VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,											//	deUint32					queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		*cmdPool,													//	VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							//	VkCommandBufferLevel		level;
		1u,															//	uint32_t					bufferCount;
	};
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));
	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		VK_COMMAND_BUFFER_USAGE_SIMULTANEOUS_USE_BIT,				// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// create event that will be used to check if secondary command buffer has been executed
	const Unique<VkEvent>					eventOne				(createEvent(vk, vkDevice));
	const Unique<VkEvent>					eventTwo				(createEvent(vk, vkDevice));

	// reset event
	VK_CHECK(vk.resetEvent(vkDevice, *eventOne));

	// record primary command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// wait for event
		vk.cmdWaitEvents(*primCmdBuf, 1u, &eventOne.get(), VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);

		// Set the second event
		vk.cmdSetEvent(*primCmdBuf, eventTwo.get(), VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	// create fence to wait for execution of queue
	const Unique<VkFence>					fence1					(createFence(vk, vkDevice));
	const Unique<VkFence>					fence2					(createFence(vk, vkDevice));


	const VkSubmitInfo						submitInfo				=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,								// sType
		DE_NULL,													// pNext
		0u,															// waitSemaphoreCount
		DE_NULL,													// pWaitSemaphores
		(const VkPipelineStageFlags*)DE_NULL,						// pWaitDstStageMask
		1,															// commandBufferCount
		&primCmdBuf.get(),											// pCommandBuffers
		0u,															// signalSemaphoreCount
		DE_NULL,													// pSignalSemaphores
	};

	// submit first buffer
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence1));

	// submit second buffer
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence2));

	// wait for both buffer to stop at event for 100 microseconds
	vk.waitForFences(vkDevice, 1, &fence1.get(), 0u, 100000);
	vk.waitForFences(vkDevice, 1, &fence2.get(), 0u, 100000);

	// set event
	VK_CHECK(vk.setEvent(vkDevice, *eventOne));

	// wait for end of execution of the first buffer
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence1.get(), 0u, INFINITE_TIMEOUT));
	// wait for end of execution of the second buffer
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence2.get(), 0u, INFINITE_TIMEOUT));

	// TODO: this will be true if the command buffer was executed only once
	// TODO: add some test that will say if it was executed twice

	// check if buffer has been executed
	VkResult result = vk.getEventStatus(vkDevice, *eventTwo);
	if (result == VK_EVENT_SET)
		return tcu::TestStatus::pass("simultaneous use - primary buffers test succeeded");
	else
		return tcu::TestStatus::fail("simultaneous use - primary buffers test FAILED");
}